

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

int32_t ucol_getDisplayName_63
                  (char *objLoc,char *dispLoc,UChar *result,int32_t resultLength,UErrorCode *status)

{
  UBool UVar1;
  Char16Ptr local_250;
  Locale local_248;
  Locale local_168;
  undefined1 local_78 [8];
  UnicodeString dst;
  UErrorCode *status_local;
  int32_t resultLength_local;
  UChar *result_local;
  char *dispLoc_local;
  char *objLoc_local;
  
  dst.fUnion._48_8_ = status;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_78);
    if ((result != (UChar *)0x0) || (resultLength != 0)) {
      icu_63::UnicodeString::setTo((UnicodeString *)local_78,result,0,resultLength);
    }
    icu_63::Locale::Locale(&local_168,objLoc,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::Locale(&local_248,dispLoc,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Collator::getDisplayName(&local_168,&local_248,(UnicodeString *)local_78);
    icu_63::Locale::~Locale(&local_248);
    icu_63::Locale::~Locale(&local_168);
    icu_63::Char16Ptr::Char16Ptr(&local_250,result);
    objLoc_local._4_4_ =
         icu_63::UnicodeString::extract
                   ((UnicodeString *)local_78,&local_250,resultLength,
                    (UErrorCode *)dst.fUnion._48_8_);
    icu_63::Char16Ptr::~Char16Ptr(&local_250);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
  }
  else {
    objLoc_local._4_4_ = -1;
  }
  return objLoc_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getDisplayName(    const    char        *objLoc,
                    const    char        *dispLoc,
                    UChar             *result,
                    int32_t         resultLength,
                    UErrorCode        *status)
{
    if(U_FAILURE(*status)) return -1;
    UnicodeString dst;
    if(!(result==NULL && resultLength==0)) {
        // NULL destination for pure preflighting: empty dummy string
        // otherwise, alias the destination buffer
        dst.setTo(result, 0, resultLength);
    }
    Collator::getDisplayName(Locale(objLoc), Locale(dispLoc), dst);
    return dst.extract(result, resultLength, *status);
}